

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O2

void __thiscall trng::xoshiro256plus::step(xoshiro256plus *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (this->S).r[0];
  uVar2 = (this->S).r[1];
  uVar4 = (this->S).r[2] ^ uVar1;
  uVar3 = uVar2 ^ (this->S).r[3];
  (this->S).r[1] = uVar4 ^ uVar2;
  (this->S).r[0] = uVar1 ^ uVar3;
  (this->S).r[2] = uVar4 ^ uVar2 << 0x11;
  (this->S).r[3] = uVar3 << 0x2d | uVar3 >> 0x13;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void xoshiro256plus::step() {
    const result_type t{S.r[1] << 17};
    S.r[2] ^= S.r[0];
    S.r[3] ^= S.r[1];
    S.r[1] ^= S.r[2];
    S.r[0] ^= S.r[3];
    S.r[2] ^= t;
    S.r[3] = (S.r[3] << 45) | (S.r[3] >> (64 - 45));
  }